

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

TextureFormat sglr::mapInternalFormat(deUint32 internalFormat)

{
  ulong uVar1;
  TextureFormat TVar2;
  ulong uVar3;
  
  if (internalFormat - 0x1906 < 5) {
    uVar3 = *(ulong *)(&DAT_0190b5e0 + (ulong)(internalFormat - 0x1906) * 8);
    uVar1 = 0x300000000;
  }
  else {
    TVar2 = glu::mapGLInternalFormat(internalFormat);
    uVar1 = (ulong)TVar2 & 0xffffffff00000000;
    uVar3 = (ulong)TVar2 & 0xffffffff;
  }
  return (TextureFormat)(uVar1 | uVar3);
}

Assistant:

static tcu::TextureFormat mapInternalFormat (deUint32 internalFormat)
{
	switch (internalFormat)
	{
		case GL_ALPHA:				return TextureFormat(TextureFormat::A,		TextureFormat::UNORM_INT8);
		case GL_LUMINANCE:			return TextureFormat(TextureFormat::L,		TextureFormat::UNORM_INT8);
		case GL_LUMINANCE_ALPHA:	return TextureFormat(TextureFormat::LA,		TextureFormat::UNORM_INT8);
		case GL_RGB:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT8);
		case GL_RGBA:				return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT8);

		default:
			return glu::mapGLInternalFormat(internalFormat);
	}
}